

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O1

MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
* __thiscall
testing::internal::
MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
::operator=(MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
            *this,MatcherBase<const_std::tuple<const_solitaire::cards::Card_*const_&,_const_solitaire::cards::Card_*const_&>_&>
                  *other)

{
  SharedPayloadBase *pSVar1;
  VTable *pVVar2;
  
  if (this != other) {
    if ((this->vtable_ != (VTable *)0x0) &&
       (this->vtable_->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
      pSVar1 = (this->buffer_).shared;
      LOCK();
      (pSVar1->ref).super___atomic_base<int>._M_i = (pSVar1->ref).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((pSVar1->ref).super___atomic_base<int>._M_i == 0) {
        (*this->vtable_->shared_destroy)((SharedPayloadBase *)(this->buffer_).ptr);
      }
    }
    pVVar2 = other->vtable_;
    this->vtable_ = pVVar2;
    this->buffer_ = other->buffer_;
    if ((pVVar2 != (VTable *)0x0) &&
       (pVVar2->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
      LOCK();
      (((this->buffer_).shared)->ref).super___atomic_base<int>._M_i =
           (((this->buffer_).shared)->ref).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

MatcherBase& operator=(const MatcherBase& other) {
    if (this == &other) return *this;
    Destroy();
    vtable_ = other.vtable_;
    buffer_ = other.buffer_;
    if (IsShared()) buffer_.shared->Ref();
    return *this;
  }